

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall
Json::Value::CZString::CZString(CZString *this,char *cstr,DuplicationPolicy allocate)

{
  char *local_30;
  DuplicationPolicy allocate_local;
  char *cstr_local;
  CZString *this_local;
  
  local_30 = cstr;
  if (allocate == duplicate) {
    local_30 = duplicateStringValue(cstr,0xffffffff);
  }
  this->cstr_ = local_30;
  this->index_ = allocate;
  return;
}

Assistant:

Value::CZString::CZString(const char* cstr, DuplicationPolicy allocate)
    : cstr_(allocate == duplicate ? duplicateStringValue(cstr) : cstr),
      index_(allocate) {}